

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mcu8str_create_from_staticbuffer
                    (mcu8str *__return_storage_ptr__,char *buf,mcu8str_size_t buflen)

{
  ulong uVar1;
  
  if (buflen - 1 >> 1 < 0x7fffffff) {
    __return_storage_ptr__->owns_memory = 0;
    __return_storage_ptr__->c_str = buf;
    *buf = '\0';
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = (uint)buflen;
    return __return_storage_ptr__;
  }
  mcu8str_create_from_staticbuffer_cold_1();
  if ((ulong)__return_storage_ptr__->size != 0) {
    uVar1 = 0;
    do {
      if (__return_storage_ptr__->c_str[uVar1] < '\0') {
        return (mcu8str *)0x0;
      }
      uVar1 = uVar1 + 1;
    } while (__return_storage_ptr__->size != uVar1);
  }
  return (mcu8str *)0x1;
}

Assistant:

mcu8str mcu8str_create_from_staticbuffer( char * buf, mcu8str_size_t buflen )
  {
    if ( buflen==0 || !MCTOOLS_STROKFORUINT(buflen-1) )
      mctools_impl_error("static buffer length out of range");
    assert(buflen > 0);
    mcu8str s;
    s.owns_memory = 0;
    s.c_str = buf;
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)buflen;
    return s;
  }